

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O0

void __thiscall Kraken::KClient::KClient(KClient *this,string *key,string *secret)

{
  EVP_PKEY_CTX *ctx;
  allocator local_2e;
  allocator local_2d [13];
  string *local_20;
  string *secret_local;
  string *key_local;
  KClient *this_local;
  
  local_20 = secret;
  secret_local = key;
  key_local = &this->key_;
  std::__cxx11::string::string((string *)this,(string *)key);
  std::__cxx11::string::string((string *)&this->secret_,(string *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->url_,"https://api.kraken.com",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  ctx = (EVP_PKEY_CTX *)0x13897b;
  std::__cxx11::string::string((string *)&this->version_,"0",&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  init(this,ctx);
  return;
}

Assistant:

KClient::KClient(const std::string& key, const std::string& secret)
   :key_(key), secret_(secret), url_("https://api.kraken.com"), version_("0") 
{ 
   init(); 
}